

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyTools.h
# Opt level: O2

void Assimp::NewellNormal<3,3,3,float>(aiVector3t<float> *out,int num,float *x,float *y,float *z)

{
  int iVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  iVar1 = num * 3;
  x[iVar1] = *x;
  iVar3 = num * 3 + 3;
  x[iVar3] = x[3];
  y[iVar1] = *y;
  y[iVar3] = y[3];
  z[iVar1] = *z;
  iVar1 = 0;
  if (0 < num) {
    iVar1 = num;
  }
  z[iVar3] = z[3];
  fVar6 = 0.0;
  fVar7 = 0.0;
  fVar5 = 0.0;
  lVar2 = 0xc;
  while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
    fVar5 = fVar5 + (*(float *)((long)y + lVar2 + 0xc) - *(float *)((long)y + lVar2 + -0xc)) *
                    *(float *)((long)x + lVar2);
    fVar6 = fVar6 + *(float *)((long)y + lVar2) *
                    (*(float *)((long)z + lVar2 + 0xc) - *(float *)((long)z + lVar2 + -0xc));
    fVar7 = fVar7 + *(float *)((long)z + lVar2) *
                    (*(float *)((long)x + lVar2 + 0xc) - *(float *)((long)x + lVar2 + -0xc));
    lVar2 = lVar2 + 0xc;
  }
  out->x = fVar6;
  out->y = fVar7;
  out->z = fVar5;
  return;
}

Assistant:

inline void NewellNormal (aiVector3t<TReal>& out, int num, TReal* x, TReal* y, TReal* z)
{
    // Duplicate the first two vertices at the end
    x[(num+0)*ofs_x] = x[0];
    x[(num+1)*ofs_x] = x[ofs_x];

    y[(num+0)*ofs_y] = y[0];
    y[(num+1)*ofs_y] = y[ofs_y];

    z[(num+0)*ofs_z] = z[0];
    z[(num+1)*ofs_z] = z[ofs_z];

    TReal sum_xy = 0.0, sum_yz = 0.0, sum_zx = 0.0;

    TReal *xptr = x +ofs_x, *xlow = x, *xhigh = x + ofs_x*2;
    TReal *yptr = y +ofs_y, *ylow = y, *yhigh = y + ofs_y*2;
    TReal *zptr = z +ofs_z, *zlow = z, *zhigh = z + ofs_z*2;

    for (int tmp=0; tmp < num; tmp++) {
        sum_xy += (*xptr) * ( (*yhigh) - (*ylow) );
        sum_yz += (*yptr) * ( (*zhigh) - (*zlow) );
        sum_zx += (*zptr) * ( (*xhigh) - (*xlow) );

        xptr  += ofs_x;
        xlow  += ofs_x;
        xhigh += ofs_x;

        yptr  += ofs_y;
        ylow  += ofs_y;
        yhigh += ofs_y;

        zptr  += ofs_z;
        zlow  += ofs_z;
        zhigh += ofs_z;
    }
    out = aiVector3t<TReal>(sum_yz,sum_zx,sum_xy);
}